

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O2

void __thiscall
Application::onMessage(Application *this,NewOrderSingle *message,SessionID *sessionID)

{
  char cVar1;
  bool bVar2;
  FieldBase *field;
  IncorrectTagValue *this_00;
  FieldBase FStack_648;
  double local_5f0;
  QTY local_5e8;
  string local_5e0;
  string local_5c0;
  FieldBase local_5a0;
  OrderQty orderQty;
  Price price;
  OrdType ordType;
  Account account;
  ClOrdID clOrdID;
  Side side;
  Symbol symbol;
  FieldBase local_2e0;
  FieldBase local_288;
  ExecutionReport executionReport;
  FieldBase local_d8;
  FieldBase local_80;
  
  FIX::Symbol::Symbol(&symbol);
  FIX::Side::Side(&side);
  FIX::OrdType::OrdType(&ordType);
  FIX::OrderQty::OrderQty(&orderQty);
  FIX::Price::Price(&price);
  FIX::ClOrdID::ClOrdID(&clOrdID);
  FIX::Account::Account(&account);
  FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&ordType);
  cVar1 = FIX::CharField::getValue(&ordType.super_CharField);
  if (cVar1 == '2') {
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&symbol);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&side);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&orderQty);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&price);
    FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&clOrdID);
    genOrderID_abi_cxx11_(&local_5c0,this);
    FIX::OrderID::OrderID((OrderID *)&FStack_648,&local_5c0);
    genExecID_abi_cxx11_(&local_5e0,this);
    FIX::ExecID::ExecID((ExecID *)&local_5a0,&local_5e0);
    FIX::ExecType::ExecType((ExecType *)&local_288,"F11Application");
    FIX::OrdStatus::OrdStatus((OrdStatus *)&local_2e0,"22F11Application");
    local_5e8 = 0.0;
    FIX::LeavesQty::LeavesQty((LeavesQty *)&local_80,&local_5e8);
    local_5f0 = FIX::DoubleField::getValue(&orderQty.super_QtyField);
    FIX::CumQty::CumQty((CumQty *)&local_d8,&local_5f0);
    FIX50::ExecutionReport::ExecutionReport
              (&executionReport,(OrderID *)&FStack_648,(ExecID *)&local_5a0,(ExecType *)&local_288,
               (OrdStatus *)&local_2e0,&side,(LeavesQty *)&local_80,(CumQty *)&local_d8);
    FIX::FieldBase::~FieldBase(&local_d8);
    FIX::FieldBase::~FieldBase(&local_80);
    FIX::FieldBase::~FieldBase(&local_2e0);
    FIX::FieldBase::~FieldBase(&local_288);
    FIX::FieldBase::~FieldBase(&local_5a0);
    std::__cxx11::string::~string((string *)&local_5e0);
    FIX::FieldBase::~FieldBase(&FStack_648);
    std::__cxx11::string::~string((string *)&local_5c0);
    FIX50::ExecutionReport::set(&executionReport,&clOrdID);
    FIX50::ExecutionReport::set(&executionReport,&symbol);
    FIX50::ExecutionReport::set(&executionReport,&orderQty);
    local_5a0._vptr_FieldBase = (_func_int **)FIX::DoubleField::getValue(&orderQty.super_QtyField);
    FIX::LastQty::LastQty((LastQty *)&FStack_648,(QTY *)&local_5a0);
    FIX50::ExecutionReport::set(&executionReport,(LastQty *)&FStack_648);
    FIX::FieldBase::~FieldBase(&FStack_648);
    local_5a0._vptr_FieldBase = (_func_int **)FIX::DoubleField::getValue(&price.super_PriceField);
    FIX::LastPx::LastPx((LastPx *)&FStack_648,(PRICE *)&local_5a0);
    FIX50::ExecutionReport::set(&executionReport,(LastPx *)&FStack_648);
    FIX::FieldBase::~FieldBase(&FStack_648);
    local_5a0._vptr_FieldBase = (_func_int **)FIX::DoubleField::getValue(&price.super_PriceField);
    FIX::AvgPx::AvgPx((AvgPx *)&FStack_648,(PRICE *)&local_5a0);
    FIX50::ExecutionReport::set(&executionReport,(AvgPx *)&FStack_648);
    FIX::FieldBase::~FieldBase(&FStack_648);
    bVar2 = FIX::FieldMap::isSetField
                      ((FieldMap *)message,account.super_StringField.super_FieldBase.m_tag);
    if (bVar2) {
      field = FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)&account);
      FIX::FieldMap::setField((FieldMap *)&executionReport,field,true);
    }
    FIX::Session::sendToTarget((Message *)&executionReport,sessionID);
    FIX::Message::~Message((Message *)&executionReport);
    FIX::FieldBase::~FieldBase((FieldBase *)&account);
    FIX::FieldBase::~FieldBase((FieldBase *)&clOrdID);
    FIX::FieldBase::~FieldBase((FieldBase *)&price);
    FIX::FieldBase::~FieldBase((FieldBase *)&orderQty);
    FIX::FieldBase::~FieldBase((FieldBase *)&ordType);
    FIX::FieldBase::~FieldBase((FieldBase *)&side);
    FIX::FieldBase::~FieldBase((FieldBase *)&symbol);
    return;
  }
  this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&executionReport,"",(allocator<char> *)&FStack_648);
  FIX::IncorrectTagValue::IncorrectTagValue
            (this_00,ordType.super_CharField.super_FieldBase.m_tag,(string *)&executionReport);
  __cxa_throw(this_00,&FIX::IncorrectTagValue::typeinfo,FIX::Exception::~Exception);
}

Assistant:

void Application::onMessage(const FIX50::NewOrderSingle &message, const FIX::SessionID &sessionID) {
  FIX::Symbol symbol;
  FIX::Side side;
  FIX::OrdType ordType;
  FIX::OrderQty orderQty;
  FIX::Price price;
  FIX::ClOrdID clOrdID;
  FIX::Account account;

  message.get(ordType);

  if (ordType != FIX::OrdType_LIMIT) {
    throw FIX::IncorrectTagValue(ordType.getTag());
  }

  message.get(symbol);
  message.get(side);
  message.get(orderQty);
  message.get(price);
  message.get(clOrdID);

  FIX50::ExecutionReport executionReport = FIX50::ExecutionReport(
      FIX::OrderID(genOrderID()),
      FIX::ExecID(genExecID()),
      FIX::ExecType(FIX::ExecType_TRADE),
      FIX::OrdStatus(FIX::OrdStatus_FILLED),
      side,
      FIX::LeavesQty(0),
      FIX::CumQty(orderQty));

  executionReport.set(clOrdID);
  executionReport.set(symbol);
  executionReport.set(orderQty);
  executionReport.set(FIX::LastQty(orderQty));
  executionReport.set(FIX::LastPx(price));
  executionReport.set(FIX::AvgPx(price));

  if (message.isSet(account)) {
    executionReport.setField(message.get(account));
  }

  try {
    FIX::Session::sendToTarget(executionReport, sessionID);
  } catch (FIX::SessionNotFound &) {}
}